

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::
ensureHostBufferPopulated(ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  CanonicalDataSource CVar1;
  element_type *this_00;
  size_t in_R8;
  _Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  _Stack_88;
  string local_70;
  string local_50;
  string local_30;
  
  CVar1 = currentCanonicalDataSource(this);
  if (CVar1 == RenderBuffer) {
    if (this->deviceBufferType - Texture1d < 3) {
      if ((this->renderTextureBuffer).
          super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_30,"render buffer should be allocated but isn\'t",
                   (allocator *)&_Stack_88);
        exception(&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
      std::__cxx11::string::string
                ((string *)&local_50,"copy-back from texture not implemented yet",
                 (allocator *)&_Stack_88);
      exception(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      this_00 = (this->renderAttributeBuffer).
                super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (this_00 == (element_type *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_70,"render buffer should be allocated but isn\'t",
                   (allocator *)&_Stack_88);
        exception(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = (this->renderAttributeBuffer).
                  super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      }
      getAttributeBufferDataRange<glm::vec<4,unsigned_int,(glm::qualifier)0>>
                ((vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                  *)&_Stack_88,(render *)this_00,(AttributeBuffer *)0x0,this_00->dataSize,in_R8);
      std::
      vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
      ::_M_move_assign(this->data,&_Stack_88);
      std::
      _Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
      ::~_Vector_base(&_Stack_88);
    }
  }
  else if (CVar1 == NeedsCompute) {
    std::function<void_()>::operator()(&this->computeFunc);
    return;
  }
  return;
}

Assistant:

void ManagedBuffer<T>::ensureHostBufferPopulated() {

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    // good to go, nothing needs to be done
    break;

  case CanonicalDataSource::NeedsCompute:

    // compute it
    computeFunc();

    break;

  case CanonicalDataSource::RenderBuffer:

    if (deviceBufferTypeIsTexture()) {
      if (!renderTextureBuffer) exception("render buffer should be allocated but isn't");

      // copy the data back from the renderBuffer
      // TODO not implemented yet
      exception("copy-back from texture not implemented yet");
    } else {
      // sanity check
      if (!renderAttributeBuffer) exception("render buffer should be allocated but isn't");

      // copy the data back from the renderBuffer
      data = getAttributeBufferDataRange<T>(*renderAttributeBuffer, 0, renderAttributeBuffer->getDataSize());
    }

    break;
  };
}